

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::ne(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  uintptr_t uVar1;
  bool bVar2;
  
  uVar1 = (this->type).id;
  switch(uVar1) {
  case 0:
  case 1:
  case 6:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x5c0);
  case 2:
    bVar2 = (this->field_0).i32 == (other->field_0).i32;
    break;
  case 3:
    bVar2 = (this->field_0).i64 == (other->field_0).i64;
    break;
  case 4:
    if ((uVar1 != 4) || ((other->type).id != 4)) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x12d,"float wasm::Literal::getf32() const");
    }
    bVar2 = *(float *)&other->field_0 != *(float *)&this->field_0;
    goto LAB_00c33fa1;
  case 5:
    if ((uVar1 != 5) || ((other->type).id != 5)) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x131,"double wasm::Literal::getf64() const");
    }
    bVar2 = *(double *)&other->field_0 != *(double *)&this->field_0;
LAB_00c33fa1:
    bVar2 = (bool)(-bVar2 & 1);
    goto LAB_00c33faf;
  default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  bVar2 = !bVar2;
LAB_00c33faf:
  *(uint *)&__return_storage_ptr__->field_0 = (uint)bVar2;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::ne(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 != other.i32);
    case Type::i64:
      return Literal(i64 != other.i64);
    case Type::f32:
      return Literal(getf32() != other.getf32());
    case Type::f64:
      return Literal(getf64() != other.getf64());
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("unexpected type");
}